

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-prefs.c
# Opt level: O3

_Bool process_pref_file(char *name,_Bool quiet,_Bool user)

{
  _Bool _Var1;
  _Bool _Var2;
  _Bool used_fallback;
  _Bool local_29;
  
  local_29 = false;
  _Var1 = process_pref_file_layered
                    (name,quiet,user,ANGBAND_DIR_CUSTOMIZE,ANGBAND_DIR_USER,&local_29);
  if (current_graphics_mode != (graphics_mode *)0x0 && !_Var1) {
    _Var1 = process_pref_file_layered
                      (name,quiet,user,current_graphics_mode->path,(char *)0x0,(_Bool *)0x0);
  }
  if (local_29 == false) {
    _Var2 = process_pref_file_layered(name,true,true,ANGBAND_DIR_USER,(char *)0x0,&local_29);
  }
  else {
    _Var2 = false;
  }
  return (_Bool)(_Var1 | _Var2);
}

Assistant:

bool process_pref_file(const char *name, bool quiet, bool user)
{
	bool root_success = false;
	bool user_success = false;
	bool used_fallback = false;

	/* This supports the old behavior: first load from lib/customize then
         * from the user location. */
	root_success = process_pref_file_layered(name, quiet, user,
											 ANGBAND_DIR_CUSTOMIZE,
											 ANGBAND_DIR_USER,
											 &used_fallback);

	/* If not found, do a check of the current graphics directory */
	if (!root_success && current_graphics_mode)
		root_success = process_pref_file_layered(name, quiet, user,
												 current_graphics_mode->path,
												 NULL, NULL);

	/* Next, we want to force a check for the file in the user location.
	 * However, since we used the user directory as a fallback in the previous
	 * check, we only want to do this if the fallback wasn't used. This cuts
	 * down on unnecessary parsing. */
	if (!used_fallback) {
		/* Force quiet (since this is an optional file) and force user
		 * (since this should always be considered user-specific). */
		user_success = process_pref_file_layered(name, true, true,
												 ANGBAND_DIR_USER, NULL,
												 &used_fallback);
	}

	/* If only one load was successful, that's okay; we loaded something. */
	return root_success || user_success;
}